

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall CChat::OnStateChange(CChat *this,int NewState,int OldState)

{
  char *pcVar1;
  long lVar2;
  
  if (OldState < 2) {
    Disable(this);
    for (lVar2 = 0x2b0; lVar2 != 0x25c40; lVar2 = lVar2 + 0x268) {
      pcVar1 = this->m_aInputBuf + lVar2 + -0x10;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    this->m_CurrentLine = 0;
    this->m_aChatBuffer[0] = '\0';
    this->m_ChatBufferMode = 0;
    this->m_FirstMap = true;
  }
  return;
}

Assistant:

void CChat::OnStateChange(int NewState, int OldState)
{
	if(OldState <= IClient::STATE_CONNECTING)
	{
		Disable();
		for(int i = 0; i < MAX_LINES; i++)
			m_aLines[i].m_Time = 0;
		m_CurrentLine = 0;
		ClearChatBuffer();
		m_FirstMap = true;
	}
}